

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

UniquePtr<X509> MakeTestCert(EVP_PKEY *key)

{
  UniquePtr<X509> x;
  int iVar1;
  X509_NAME *name;
  ASN1_TIME *pAVar2;
  ASN1_TIME *pAVar3;
  EVP_MD *md;
  EVP_PKEY *in_RSI;
  UniquePtr<X509> x509;
  
  x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_x509_st_*,_false>
  ._M_head_impl = (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)X509_new();
  if ((tuple<x509_st_*,_bssl::internal::Deleter>)
      x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_x509_st_*,_false>._M_head_impl != (_Head_base<0UL,_x509_st_*,_false>)0x0
     ) {
    name = X509_get_subject_name
                     ((X509 *)x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
    pAVar2 = X509_get_notBefore((X509 *)x509._M_t.
                                        super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                                        .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
    pAVar3 = X509_gmtime_adj((ASN1_TIME *)pAVar2,0);
    if (pAVar3 != (ASN1_TIME *)0x0) {
      pAVar2 = X509_get_notAfter((X509 *)x509._M_t.
                                         super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                         _M_t.
                                         super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
      pAVar3 = X509_gmtime_adj((ASN1_TIME *)pAVar2,0x15180);
      if (pAVar3 != (ASN1_TIME *)0x0) {
        iVar1 = X509_NAME_add_entry_by_txt(name,"CN",0x1001,"Test",-1,-1,0);
        if (iVar1 != 0) {
          iVar1 = X509_set_issuer_name
                            ((X509 *)x509._M_t.
                                     super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,name);
          if (iVar1 != 0) {
            iVar1 = X509_set_pubkey((X509 *)x509._M_t.
                                            super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,
                                    in_RSI);
            x = x509;
            if (iVar1 != 0) {
              md = EVP_sha256();
              iVar1 = X509_sign((X509 *)x._M_t.
                                        super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                                        .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl,in_RSI,
                                md);
              if (iVar1 != 0) {
                *(__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true> *)key =
                     x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_x509_st_*,_false>._M_head_impl;
                x509._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_x509_st_*,_false>._M_head_impl =
                     (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
                     (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
                goto LAB_002fec40;
              }
            }
          }
        }
      }
    }
  }
  key->references = 0;
  key->type = 0;
LAB_002fec40:
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&x509);
  return (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<x509_st,_bssl::internal::Deleter,_true,_true>)key;
}

Assistant:

static bssl::UniquePtr<X509> MakeTestCert(EVP_PKEY *key) {
  bssl::UniquePtr<X509> x509(X509_new());
  if (!x509) {
    return nullptr;
  }
  X509_NAME* subject = X509_get_subject_name(x509.get());
  if (!X509_gmtime_adj(X509_get_notBefore(x509.get()), 0) ||
      !X509_gmtime_adj(X509_get_notAfter(x509.get()), 60 * 60 * 24) ||
      !X509_NAME_add_entry_by_txt(subject, "CN", MBSTRING_ASC,
                                  reinterpret_cast<const uint8_t *>("Test"), -1,
                                  -1, 0) ||
      !X509_set_issuer_name(x509.get(), subject) ||
      !X509_set_pubkey(x509.get(), key) ||
      !X509_sign(x509.get(), key, EVP_sha256())) {
    return nullptr;
  }
  return x509;
}